

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O1

void AbortMission(void)

{
  int iVar1;
  timespec local_20;
  
  bWaiting = 0;
  pthread_mutex_lock((pthread_mutex_t *)&MissionFilesCS);
  if (bMissionRunning != 0) {
    bMissionRunning = 0;
    puts("Mission stopped.");
    if (chrono_mission.Suspended == 0) {
      clock_gettime(4,&local_20);
      chrono_mission.Finish.tv_sec = local_20.tv_sec;
      chrono_mission.Finish.tv_nsec = local_20.tv_nsec;
      local_20.tv_sec =
           (local_20.tv_sec + chrono_mission.Duration.tv_sec +
           (local_20.tv_nsec + chrono_mission.Duration.tv_nsec) / 1000000000) -
           chrono_mission.Start.tv_sec;
      local_20.tv_nsec =
           (local_20.tv_nsec + chrono_mission.Duration.tv_nsec) % 1000000000 -
           chrono_mission.Start.tv_nsec;
      if (local_20.tv_nsec < 0) {
        local_20.tv_sec = local_20.tv_sec + local_20.tv_nsec / 1000000000 + -1;
        local_20.tv_nsec = local_20.tv_nsec % 1000000000 + 1000000000;
      }
      chrono_mission.Duration.tv_sec = local_20.tv_sec;
      chrono_mission.Duration.tv_nsec = local_20.tv_nsec;
    }
    if (logmissionfile != (FILE *)0x0) {
      iVar1 = fclose((FILE *)logmissionfile);
      if (iVar1 != 0) {
        puts("Error closing log file.");
      }
    }
    iVar1 = fclose((FILE *)missionfile);
    if (iVar1 != 0) {
      puts("Error closing mission file.");
    }
    missionfile = (FILE *)0x0;
    procstack = 0;
    memset(procstackids,0,0x400);
    memset(procreturnaddrs,0,0x400);
    memset(procdefineaddrs,0,0x400);
    memset(labels,0,0x1000);
    if (bMissionPaused == 0) {
      bMissionAtStartup = 0;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
  pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
  bFollowMeTrackingControl = 0;
  bObstacleAvoidanceControl = 0;
  bLineFollowingControl = 0;
  bWaypointControl = 0;
  bGuidedControl = 0;
  bDistanceControl = 0;
  bBrakeControl = 0;
  bSailControl = 0;
  bHeadingControl = 0;
  bPitchControl = 0;
  bRollControl = 0;
  bDepthControl = 0;
  bAltitudeAGLControl = 0;
  u = 0.0;
  uw = 0.0;
  ul = 0.0;
  up = 0.0;
  ur = 0.0;
  uv = 0.0;
  pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
  pthread_mutex_lock((pthread_mutex_t *)&MDMCS);
  AcousticCommandMDM = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&MDMCS);
  return;
}

Assistant:

inline void AbortMission(void)
{
	bWaiting = FALSE;
	EnterCriticalSection(&MissionFilesCS);
	if (bMissionRunning)
	{
		bMissionRunning = FALSE;
		printf("Mission stopped.\n");
		StopChronoQuick(&chrono_mission);
		if ((logmissionfile != NULL)&&(fclose(logmissionfile) != EXIT_SUCCESS))
		{
			printf("Error closing log file.\n");
		}
		if (fclose(missionfile) != EXIT_SUCCESS) 
		{
			printf("Error closing mission file.\n");
		}
		missionfile = NULL;
		procstack = 0;
		memset(procstackids, 0, sizeof(procstackids));
		memset(procreturnaddrs, 0, sizeof(procreturnaddrs));
		memset(procdefineaddrs, 0, sizeof(procdefineaddrs));
		memset(labels, 0, sizeof(labels));
		if (!bMissionPaused) bMissionAtStartup = FALSE; // To indicate that potential next missions were not launched at startup...
	}
	LeaveCriticalSection(&MissionFilesCS);
	DisableAllControls();
}